

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ElabSystemTaskSymbol::reportStaticAssert
          (ElabSystemTaskSymbol *this,Scope *scope,SourceLocation loc,string_view message,
          Expression *condition)

{
  bool bVar1;
  Diagnostic *pDVar2;
  BinaryExpression *expr;
  allocator<char> local_69;
  string local_68;
  char *local_48;
  undefined4 local_3c;
  Diagnostic *local_38;
  Diagnostic *diag;
  Expression *condition_local;
  Scope *scope_local;
  string_view message_local;
  SourceLocation loc_local;
  
  diag = (Diagnostic *)message._M_str;
  message_local._M_len = message._M_len;
  condition_local = (Expression *)this;
  scope_local = (Scope *)loc;
  message_local._M_str = (char *)scope;
  if (((diag == (Diagnostic *)0x0) ||
      ((diag->args).
       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0)) ||
     (bVar1 = slang::ConstantValue::isTrue
                        ((ConstantValue *)
                         (diag->args).
                         super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar1)) {
    local_3c = 0x8f0006;
    local_48 = message_local._M_str;
    pDVar2 = Scope::addDiag((Scope *)condition_local,(DiagCode)0x8f0006,
                            (SourceLocation)message_local._M_str);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_68,(basic_string_view<char,_std::char_traits<char>_> *)&scope_local,
               &local_69);
    pDVar2 = Diagnostic::addStringAllowEmpty(pDVar2,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    if ((diag != (Diagnostic *)0x0) &&
       (*(int *)&(diag->args).
                 super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0xb)) {
      local_38 = pDVar2;
      expr = Expression::as<slang::ast::BinaryExpression>((Expression *)diag);
      reduceComparison(expr,local_38);
    }
  }
  return;
}

Assistant:

void ElabSystemTaskSymbol::reportStaticAssert(const Scope& scope, SourceLocation loc,
                                              string_view message, const Expression* condition) {
    if (condition && condition->constant) {
        // Issue no diagnostic if the assert condition is true.
        if (condition->constant->isTrue())
            return;
    }

    auto& diag = scope.addDiag(diag::StaticAssert, loc).addStringAllowEmpty(std::string(message));

    // If the condition is a comparison operator, note the value of both
    // sides to provide more info about why the assertion failed.
    if (condition && condition->kind == ExpressionKind::BinaryOp)
        reduceComparison(condition->as<BinaryExpression>(), diag);
}